

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_yin.c
# Opt level: O2

lys_node *
read_yin_choice(lys_module *module,lys_node *parent,lyxml_elem *yin,int options,unres_schema *unres)

{
  ly_ctx *ctx;
  long lVar1;
  LY_ECODE ecode;
  bool bVar2;
  int iVar3;
  lys_node *child;
  lys_module *module_00;
  lys_node *plVar4;
  lys_iffeature *plVar5;
  lys_ext_instance **pplVar6;
  ushort uVar7;
  LYS_NODE type;
  lyxml_elem *elem;
  char *pcVar8;
  char *pcVar9;
  lyxml_elem *plVar10;
  lyxml_elem *plVar11;
  size_t __n;
  long lVar12;
  int local_64;
  
  ctx = module->ctx;
  child = (lys_node *)calloc(1,0x78);
  if (child == (lys_node *)0x0) {
    ly_log(ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","read_yin_choice");
    return (lys_node *)0x0;
  }
  child->nodetype = LYS_CHOICE;
  child->prev = child;
  iVar3 = 0x19;
  if ((options & 2U) == 0) {
    iVar3 = (uint)((options & 1U) == 0) * 4 + 0x13;
  }
  iVar3 = read_yin_common(module,parent,child,LYEXT_PAR_NODE,yin,iVar3,unres);
  if (iVar3 == 0) {
    ly_log_dbg(4,"parsing %s statement \"%s\"",yin->name,child->name);
    module_00 = lys_main_module(module);
    iVar3 = lys_node_addchild(parent,module_00,child,options);
    if (iVar3 == 0) {
      plVar11 = yin->child;
      bVar2 = false;
      local_64 = 0;
      lVar12 = 0;
      elem = (lyxml_elem *)0x0;
LAB_00132e7b:
      lVar12 = (long)(int)lVar12;
      __n = lVar12 * 8;
      plVar10 = plVar11;
      while( true ) {
        if (plVar10 == (lyxml_elem *)0x0) {
          if (local_64 != 0) {
            plVar5 = (lys_iffeature *)calloc((long)local_64,0x20);
            child->iffeature = plVar5;
            if (plVar5 == (lys_iffeature *)0x0) {
              ly_log(ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","read_yin_choice");
              goto LAB_00132e20;
            }
          }
          if ((int)lVar12 != 0) {
            pplVar6 = (lys_ext_instance **)realloc(child->ext,((ulong)child->ext_size + lVar12) * 8)
            ;
            if (pplVar6 == (lys_ext_instance **)0x0) {
              ly_log(ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","read_yin_choice");
              goto LAB_00132e20;
            }
            child->ext = pplVar6;
            memset(pplVar6 + child->ext_size,0,__n);
          }
          plVar11 = yin->child;
          goto LAB_0013328f;
        }
        plVar11 = plVar10->next;
        iVar3 = strcmp(plVar10->ns->value,"urn:ietf:params:xml:ns:yang:yin:1");
        if (iVar3 == 0) break;
        if ((int)lVar12 == 0xff) {
          pcVar8 = "extensions";
          goto LAB_00133340;
        }
        lVar12 = lVar12 + 1;
        __n = __n + 8;
        plVar10 = plVar11;
      }
      pcVar8 = plVar10->name;
      iVar3 = strcmp(pcVar8,"container");
      if (iVar3 == 0) {
        plVar4 = read_yin_container(module,child,plVar10,options,unres);
      }
      else {
        iVar3 = strcmp(pcVar8,"leaf-list");
        if (iVar3 == 0) {
          plVar4 = read_yin_leaflist(module,child,plVar10,options,unres);
          goto LAB_00133169;
        }
        iVar3 = strcmp(pcVar8,"leaf");
        if (iVar3 == 0) {
          plVar4 = read_yin_leaf(module,child,plVar10,options,unres);
          goto LAB_00133169;
        }
        iVar3 = strcmp(pcVar8,"list");
        if (iVar3 == 0) {
          plVar4 = read_yin_list(module,child,plVar10,options,unres);
          goto LAB_00133169;
        }
        iVar3 = strcmp(pcVar8,"case");
        if (iVar3 == 0) {
          plVar4 = read_yin_case(module,child,plVar10,options,unres);
          goto LAB_00133169;
        }
        iVar3 = strcmp(pcVar8,"anyxml");
        if (iVar3 == 0) {
          type = LYS_ANYXML;
LAB_00133095:
          plVar4 = read_yin_anydata(module,child,plVar10,type,options,unres);
          goto LAB_00133169;
        }
        iVar3 = strcmp(pcVar8,"anydata");
        if (iVar3 == 0) {
          type = LYS_ANYDATA;
          goto LAB_00133095;
        }
        iVar3 = strcmp(pcVar8,"default");
        if (iVar3 == 0) {
          if (elem != (lyxml_elem *)0x0) {
            ly_vlog(ctx,LYE_TOOMANY,LY_VLOG_LYS,child,pcVar8,yin->name);
            goto LAB_00132e20;
          }
          iVar3 = lyp_yin_parse_subnode_ext
                            (module,child,LYEXT_PAR_NODE,plVar10,LYEXT_SUBSTMT_DEFAULT,'\0',unres);
          if (iVar3 != 0) goto LAB_0013354b;
          lyxml_unlink_elem(ctx,plVar10,0);
          elem = plVar10;
          goto LAB_00132e7b;
        }
        iVar3 = strcmp(pcVar8,"mandatory");
        if (iVar3 == 0) {
          if (bVar2) {
            pcVar9 = yin->name;
            ecode = LYE_TOOMANY;
LAB_001335b2:
            ly_vlog(ctx,ecode,LY_VLOG_LYS,child,pcVar8,pcVar9);
          }
          else {
            pcVar8 = lyxml_get_attr(plVar10,"value",(char *)0x0);
            if (pcVar8 == (char *)0x0) {
              ly_vlog(ctx,LYE_MISSARG,LY_VLOG_NONE,(void *)0x0,"value",plVar10->name);
            }
            else {
              iVar3 = strcmp(pcVar8,"true");
              if (iVar3 == 0) {
                uVar7 = 0x40;
              }
              else {
                iVar3 = strcmp(pcVar8,"false");
                uVar7 = 0x80;
                if (iVar3 != 0) {
                  pcVar9 = plVar10->name;
                  ecode = LYE_INARG;
                  goto LAB_001335b2;
                }
              }
              child->flags = child->flags | uVar7;
              bVar2 = true;
              iVar3 = lyp_yin_parse_subnode_ext
                                (module,child,LYEXT_PAR_NODE,plVar10,LYEXT_SUBSTMT_MANDATORY,'\0',
                                 unres);
              if (iVar3 == 0) goto LAB_00133172;
            }
          }
          goto LAB_00132e20;
        }
        iVar3 = strcmp(pcVar8,"when");
        if (iVar3 == 0) {
          lVar1._0_1_ = child->hash[0];
          lVar1._1_1_ = child->hash[1];
          lVar1._2_1_ = child->hash[2];
          lVar1._3_1_ = child->hash[3];
          lVar1._4_4_ = *(undefined4 *)&child->field_0x6c;
          if (lVar1 == 0) {
            plVar4 = (lys_node *)read_yin_when(module,plVar10,unres);
            *(lys_node **)child->hash = plVar4;
            goto LAB_00133169;
          }
          ly_vlog(ctx,LYE_TOOMANY,LY_VLOG_LYS,child,pcVar8,yin->name);
          goto LAB_00132e20;
        }
        iVar3 = strcmp(pcVar8,"if-feature");
        if (iVar3 == 0) {
          if (local_64 == 0xff) {
            pcVar8 = "if-features";
LAB_00133340:
            ly_log(ctx,LY_LLERR,LY_EINT,"Reached limit (%lu) for storing %s in %s statement.",0xff,
                   pcVar8,"choice");
            goto LAB_00132e20;
          }
          local_64 = local_64 + 1;
          goto LAB_00132e7b;
        }
        if (((module->field_0x40 & 0xc) == 0) || (iVar3 = strcmp(pcVar8,"choice"), iVar3 != 0)) {
          ly_vlog(ctx,LYE_INSTMT,LY_VLOG_LYS,child,pcVar8);
          goto LAB_00132e20;
        }
        plVar4 = read_yin_choice(module,child,plVar10,options,unres);
      }
LAB_00133169:
      if (plVar4 == (lys_node *)0x0) goto LAB_00132e20;
LAB_00133172:
      lyxml_free(ctx,plVar10);
      goto LAB_00132e7b;
    }
  }
  elem = (lyxml_elem *)0x0;
  goto LAB_00132e20;
LAB_0013354b:
  elem = (lyxml_elem *)0x0;
  goto LAB_00132e20;
  while( true ) {
    plVar10 = plVar11->next;
    iVar3 = strcmp(plVar11->ns->value,"urn:ietf:params:xml:ns:yang:yin:1");
    if (iVar3 == 0) {
      iVar3 = fill_yin_iffeature(child,0,plVar11,child->iffeature + child->iffeature_size,unres);
      child->iffeature_size = child->iffeature_size + '\x01';
    }
    else {
      iVar3 = lyp_yin_fill_ext(child,LYEXT_PAR_NODE,LYEXT_SUBSTMT_SELF,'\0',module,plVar11,
                               &child->ext,child->ext_size,unres);
      child->ext_size = child->ext_size + '\x01';
    }
    plVar11 = plVar10;
    if (iVar3 != 0) break;
LAB_0013328f:
    if (plVar11 == (lyxml_elem *)0x0) {
      if (elem != (lyxml_elem *)0x0) {
        if ((child->flags & 0x40) != 0) {
          ly_vlog(ctx,LYE_INCHILDSTMT,LY_VLOG_LYS,child,"default","choice");
          ly_vlog(ctx,LYE_SPEC,LY_VLOG_PREV,(void *)0x0,
                  "The \"default\" statement is forbidden on choices with \"mandatory\".");
          break;
        }
        pcVar8 = lyxml_get_attr(elem,"value",(char *)0x0);
        if (pcVar8 == (char *)0x0) {
          ly_vlog(ctx,LYE_MISSARG,LY_VLOG_NONE,(void *)0x0,"value",elem->name);
          break;
        }
        iVar3 = unres_schema_add_str(module,unres,child,UNRES_CHOICE_DFLT,pcVar8);
        if (iVar3 == -1) break;
        lyxml_free(ctx,elem);
      }
      if (((ctx->models).flags & 2) != 0) {
        return child;
      }
      lVar12._0_1_ = child->hash[0];
      lVar12._1_1_ = child->hash[1];
      lVar12._2_1_ = child->hash[2];
      lVar12._3_1_ = child->hash[3];
      lVar12._4_4_ = *(undefined4 *)&child->field_0x6c;
      if (lVar12 == 0) {
        return child;
      }
      if ((options & 4U) == 0) {
        iVar3 = unres_schema_add_node(module,unres,child,UNRES_XPATH,(lys_node *)0x0);
        if (iVar3 != -1) {
          return child;
        }
      }
      else {
        iVar3 = lyxp_node_check_syntax(child);
        if (iVar3 == 0) {
          return child;
        }
      }
      break;
    }
  }
LAB_00132e20:
  lyxml_free(ctx,elem);
  lys_node_free(child,(_func_void_lys_node_ptr_void_ptr *)0x0,0);
  return (lys_node *)0x0;
}

Assistant:

static struct lys_node *
read_yin_choice(struct lys_module *module, struct lys_node *parent, struct lyxml_elem *yin, int options,
                struct unres_schema *unres)
{
    struct lyxml_elem *sub, *next, *dflt = NULL;
    struct ly_ctx *const ctx = module->ctx;
    struct lys_node *retval, *node = NULL;
    struct lys_node_choice *choice;
    const char *value;
    int f_mand = 0, c_ftrs = 0, c_ext = 0, ret;
    void *reallocated;

    choice = calloc(1, sizeof *choice);
    LY_CHECK_ERR_RETURN(!choice, LOGMEM(ctx), NULL);

    choice->nodetype = LYS_CHOICE;
    choice->prev = (struct lys_node *)choice;
    retval = (struct lys_node *)choice;

    if (read_yin_common(module, parent, retval, LYEXT_PAR_NODE, yin,
            OPT_IDENT | OPT_MODULE | ((options & LYS_PARSE_OPT_CFG_IGNORE) ? OPT_CFG_IGNORE :
                (options & LYS_PARSE_OPT_CFG_NOINHERIT) ? OPT_CFG_PARSE : OPT_CFG_PARSE | OPT_CFG_INHERIT),
            unres)) {
        goto error;
    }

    LOGDBG(LY_LDGYIN, "parsing %s statement \"%s\"", yin->name, retval->name);

    /* insert the node into the schema tree */
    if (lys_node_addchild(parent, lys_main_module(module), retval, options)) {
        goto error;
    }

    /* process choice's specific children */
    LY_TREE_FOR_SAFE(yin->child, next, sub) {
        if (strcmp(sub->ns->value, LY_NSYIN)) {
            /* extension */
            YIN_CHECK_ARRAY_OVERFLOW_GOTO(ctx, c_ext, retval->ext_size, "extensions", "choice", error);
            c_ext++;
            /* keep it for later processing, skip lyxml_free() */
            continue;
        } else if (!strcmp(sub->name, "container")) {
            if (!(node = read_yin_container(module, retval, sub, options, unres))) {
                goto error;
            }
        } else if (!strcmp(sub->name, "leaf-list")) {
            if (!(node = read_yin_leaflist(module, retval, sub, options, unres))) {
                goto error;
            }
        } else if (!strcmp(sub->name, "leaf")) {
            if (!(node = read_yin_leaf(module, retval, sub, options, unres))) {
                goto error;
            }
        } else if (!strcmp(sub->name, "list")) {
            if (!(node = read_yin_list(module, retval, sub, options, unres))) {
                goto error;
            }
        } else if (!strcmp(sub->name, "case")) {
            if (!(node = read_yin_case(module, retval, sub, options, unres))) {
                goto error;
            }
        } else if (!strcmp(sub->name, "anyxml")) {
            if (!(node = read_yin_anydata(module, retval, sub, LYS_ANYXML, options, unres))) {
                goto error;
            }
        } else if (!strcmp(sub->name, "anydata")) {
            if (!(node = read_yin_anydata(module, retval, sub, LYS_ANYDATA, options, unres))) {
                goto error;
            }
        } else if (!strcmp(sub->name, "default")) {
            if (dflt) {
                LOGVAL(ctx, LYE_TOOMANY, LY_VLOG_LYS, retval, sub->name, yin->name);
                goto error;
            }

            if (lyp_yin_parse_subnode_ext(module, retval, LYEXT_PAR_NODE, sub, LYEXT_SUBSTMT_DEFAULT, 0, unres)) {
                goto error;
            }

            dflt = sub;
            lyxml_unlink_elem(ctx, dflt, 0);
            continue;
            /* skip lyxml_free() at the end of the loop, the sub node is processed later as dflt */

        } else if (!strcmp(sub->name, "mandatory")) {
            if (f_mand) {
                LOGVAL(ctx, LYE_TOOMANY, LY_VLOG_LYS, retval, sub->name, yin->name);
                goto error;
            }
            /* just checking the flags in leaf is not sufficient, we would allow
             * multiple mandatory statements with the "false" value
             */
            f_mand = 1;

            GETVAL(ctx, value, sub, "value");
            if (!strcmp(value, "true")) {
                choice->flags |= LYS_MAND_TRUE;
            } else if (!strcmp(value, "false")) {
                choice->flags |= LYS_MAND_FALSE;
            } else {
                LOGVAL(ctx, LYE_INARG, LY_VLOG_LYS, retval, value, sub->name);
                goto error;
            }                   /* else false is the default value, so we can ignore it */

            if (lyp_yin_parse_subnode_ext(module, retval, LYEXT_PAR_NODE, sub, LYEXT_SUBSTMT_MANDATORY, 0, unres)) {
                goto error;
            }
        } else if (!strcmp(sub->name, "when")) {
            if (choice->when) {
                LOGVAL(ctx, LYE_TOOMANY, LY_VLOG_LYS, retval, sub->name, yin->name);
                goto error;
            }

            choice->when = read_yin_when(module, sub, unres);
            if (!choice->when) {
                goto error;
            }
        } else if (!strcmp(sub->name, "if-feature")) {
            YIN_CHECK_ARRAY_OVERFLOW_GOTO(ctx, c_ftrs, retval->iffeature_size, "if-features", "choice", error);
            c_ftrs++;

            /* skip lyxml_free() at the end of the loop, the sub node is processed later */
            continue;
        } else if (module->version >= 2 && !strcmp(sub->name, "choice")) {
            if (!(node = read_yin_choice(module, retval, sub, options, unres))) {
                goto error;
            }
        } else {
            LOGVAL(ctx, LYE_INSTMT, LY_VLOG_LYS, retval, sub->name);
            goto error;
        }

        node = NULL;
        lyxml_free(ctx, sub);
    }

    if (c_ftrs) {
        choice->iffeature = calloc(c_ftrs, sizeof *choice->iffeature);
        LY_CHECK_ERR_GOTO(!choice->iffeature, LOGMEM(ctx), error);
    }
    if (c_ext) {
        /* some extensions may be already present from the substatements */
        reallocated = realloc(retval->ext, (c_ext + retval->ext_size) * sizeof *retval->ext);
        LY_CHECK_ERR_GOTO(!reallocated, LOGMEM(ctx), error);
        retval->ext = reallocated;

        /* init memory */
        memset(&retval->ext[retval->ext_size], 0, c_ext * sizeof *retval->ext);
    }

    LY_TREE_FOR_SAFE(yin->child, next, sub) {
        if (strcmp(sub->ns->value, LY_NSYIN)) {
            /* extension */
            ret = lyp_yin_fill_ext(retval, LYEXT_PAR_NODE, 0, 0, module, sub, &retval->ext, retval->ext_size, unres);
            retval->ext_size++;
            if (ret) {
                goto error;
            }
        } else {
            ret = fill_yin_iffeature(retval, 0, sub, &choice->iffeature[choice->iffeature_size], unres);
            choice->iffeature_size++;
            if (ret) {
                goto error;
            }
        }
    }

    /* check - default is prohibited in combination with mandatory */
    if (dflt && (choice->flags & LYS_MAND_TRUE)) {
        LOGVAL(ctx, LYE_INCHILDSTMT, LY_VLOG_LYS, retval, "default", "choice");
        LOGVAL(ctx, LYE_SPEC, LY_VLOG_PREV, NULL, "The \"default\" statement is forbidden on choices with \"mandatory\".");
        goto error;
    }

    /* link default with the case */
    if (dflt) {
        GETVAL(ctx, value, dflt, "value");
        if (unres_schema_add_str(module, unres, choice, UNRES_CHOICE_DFLT, value) == -1) {
            goto error;
        }
        lyxml_free(ctx, dflt);
    }

    /* check XPath dependencies */
    if (!(ctx->models.flags & LY_CTX_TRUSTED) && choice->when) {
        if (options & LYS_PARSE_OPT_INGRP) {
            if (lyxp_node_check_syntax(retval)) {
                goto error;
            }
        } else {
            if (unres_schema_add_node(module, unres, retval, UNRES_XPATH, NULL) == -1) {
                goto error;
            }
        }
    }

    return retval;

error:
    lyxml_free(ctx, dflt);
    lys_node_free(retval, NULL, 0);
    return NULL;
}